

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void compute_gradient_info_sb(MACROBLOCK *x,BLOCK_SIZE sb_size,PLANE_TYPE plane)

{
  int iVar1;
  long in_RDI;
  PLANE_TYPE in_stack_0000004e;
  BLOCK_SIZE in_stack_0000004f;
  MACROBLOCK *in_stack_00000050;
  
  iVar1 = is_cur_buf_hbd((MACROBLOCKD *)(in_RDI + 0x1a0));
  if (iVar1 == 0) {
    lowbd_compute_gradient_info_sb(in_stack_00000050,in_stack_0000004f,in_stack_0000004e);
  }
  else {
    highbd_compute_gradient_info_sb(in_stack_00000050,in_stack_0000004f,in_stack_0000004e);
  }
  return;
}

Assistant:

static inline void compute_gradient_info_sb(MACROBLOCK *const x,
                                            BLOCK_SIZE sb_size,
                                            PLANE_TYPE plane) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(&x->e_mbd)) {
    highbd_compute_gradient_info_sb(x, sb_size, plane);
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  lowbd_compute_gradient_info_sb(x, sb_size, plane);
}